

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O0

void __thiscall
TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
_extractValue(ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,string *val)

{
  ulong uVar1;
  CmdLineParseException *this_00;
  string local_120 [32];
  undefined1 local_100 [32];
  char local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [112];
  ArgParseException *e;
  StringLike local_20;
  string *local_18;
  string *val_local;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20._vptr_StringLike = (_func_int **)0x0;
  local_18 = val;
  val_local = (string *)this;
  StringLike::StringLike(&local_20);
  ExtractValue<std::__cxx11::string>(&this->_value,val,&local_20);
  StringLike::~StringLike(&local_20);
  if ((this->_constraint !=
       (Constraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0) &&
     (uVar1 = (**(code **)(*(long *)this->_constraint + 0x10))(this->_constraint,&this->_value),
     (uVar1 & 1) == 0)) {
    this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
    std::operator+(local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "Value \'");
    std::operator+(local_c0,local_e0);
    (*(code *)**(undefined8 **)this->_constraint)(local_100);
    std::operator+(local_a0,local_c0);
    (*(this->super_Arg)._vptr_Arg[7])(local_120);
    CmdLineParseException::CmdLineParseException(this_00,local_a0,local_120);
    __cxa_throw(this_00,&CmdLineParseException::typeinfo,
                CmdLineParseException::~CmdLineParseException);
  }
  return;
}

Assistant:

void ValueArg<T>::_extractValue( const std::string& val ) 
{
    try {
	ExtractValue(_value, val, typename ArgTraits<T>::ValueCategory());
    } catch( ArgParseException &e) {
	throw ArgParseException(e.error(), toString());
    }
    
    if ( _constraint != NULL )
	if ( ! _constraint->check( _value ) )
	    throw( CmdLineParseException( "Value '" + val + 
					  + "' does not meet constraint: " 
					  + _constraint->description(),
					  toString() ) );
}